

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example-misc.cc
# Opt level: O2

void demo_image(void)

{
  ostream *poVar1;
  int iVar2;
  int iVar3;
  int i;
  int iVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  allocator<char> local_269;
  vector<double,_std::allocator<double>_> row;
  double z;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  image;
  Gnuplot gp;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&row,"",(allocator<char> *)&z);
  gnuplotio::Gnuplot::Gnuplot(&gp,(string *)&row);
  std::__cxx11::string::~string((string *)&row);
  image.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  image.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  image.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (iVar3 = 0; iVar3 != 100; iVar3 = iVar3 + 1) {
    row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    dVar6 = (double)(iVar3 + -0x32) / 5.0;
    iVar4 = 0;
    iVar2 = 100;
    while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
      dVar7 = (double)(iVar4 + -0x32) / 5.0;
      z = cos(SQRT(dVar7 * dVar7 + dVar6 * dVar6));
      std::vector<double,_std::allocator<double>_>::push_back(&row,&z);
      iVar4 = iVar4 + 1;
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&image,(value_type *)&row);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&row);
  }
  poVar1 = std::operator<<((ostream *)&gp,"plot \'-\' binary");
  std::__cxx11::string::string<std::allocator<char>>((string *)&z,"array",&local_269);
  gnuplotio::Gnuplot::
  binfmt<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,gnuplotio::Mode2D>
            (&row,&gp,&image,&z);
  poVar1 = std::operator<<(poVar1,(string *)&row);
  std::operator<<(poVar1,"with image\n");
  std::__cxx11::string::~string((string *)&row);
  std::__cxx11::string::~string((string *)&z);
  gnuplotio::Gnuplot::
  sendBinary<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,gnuplotio::Mode2D>
            (&gp,&image);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&image);
  gnuplotio::Gnuplot::~Gnuplot(&gp);
  return;
}

Assistant:

void demo_image() {
    // Example of plotting an image.  Of course you are free (and encouraged) to
    // use Blitz or Armadillo rather than std::vector in these situations.

    Gnuplot gp;

    std::vector<std::vector<double>> image;
    for(int j=0; j<100; j++) {
        std::vector<double> row;
        for(int i=0; i<100; i++) {
            double x = (i-50.0)/5.0;
            double y = (j-50.0)/5.0;
            double z = std::cos(sqrt(x*x+y*y));
            row.push_back(z);
        }
        image.push_back(row);
    }

    // It may seem counterintuitive that send1d should be used rather than
    // send2d.  The explanation is as follows.  The "send2d" method puts each
    // value on its own line, with blank lines between rows.  This is what is
    // expected by the splot command.  The two "dimensions" here are the lines
    // and the blank-line-delimited blocks.  The "send1d" method doesn't group
    // things into blocks.  So the elements of each row are printed as columns,
    // as expected by Gnuplot's "matrix with image" command.  But images
    // typically have lots of pixels, so sending as text is not the most
    // efficient (although, it's not really that bad in the case of this
    // example).  See the binary version below.
    //
    //gp << "plot '-' matrix with image\n";
    //gp.send1d(image);

    // To be honest, Gnuplot's documentation for "binary" and for "image" are
    // both unclear to me.  The following example comes by trial-and-error.
    gp << "plot '-' binary" << gp.binFmt2d(image, "array") << "with image\n";
    gp.sendBinary2d(image);

    pause_if_needed();
}